

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdphuff.c
# Opt level: O1

boolean decode_mcu_DC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int *piVar1;
  int iVar2;
  jpeg_entropy_decoder *pjVar3;
  JBLOCKROW paJVar4;
  jpeg_error_mgr *pjVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  
  pjVar3 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)((long)&pjVar3[3].start_pass + 4) == 0) {
      process_restart(cinfo);
    }
    piVar1 = (int *)((long)&pjVar3[3].start_pass + 4);
    *piVar1 = *piVar1 + -1;
  }
  if ((pjVar3[1].insufficient_data != -1) && (0 < cinfo->blocks_in_MCU)) {
    lVar9 = 0;
    do {
      paJVar4 = MCU_data[lVar9];
      lVar12 = (long)cinfo->MCU_membership[lVar9];
      iVar2 = cinfo->cur_comp_info[lVar12]->dc_tbl_no;
      p_Var10 = (&pjVar3[3].decode_mcu)[iVar2] +
                *(int *)((long)&pjVar3[2].decode_mcu + lVar12 * 4 + 4);
      iVar6 = arith_decode(cinfo,(uchar *)p_Var10);
      if (iVar6 == 0) {
        *(undefined4 *)((long)&pjVar3[2].decode_mcu + lVar12 * 4 + 4) = 0;
      }
      else {
        uVar7 = arith_decode(cinfo,(uchar *)(p_Var10 + 1));
        p_Var10 = p_Var10 + (ulong)uVar7 + 2;
        iVar6 = arith_decode(cinfo,(uchar *)p_Var10);
        uVar13 = 0;
        if (iVar6 != 0) {
          p_Var10 = (&pjVar3[3].decode_mcu)[iVar2] + 0x14;
          iVar6 = arith_decode(cinfo,(uchar *)p_Var10);
          uVar13 = 1;
          while (iVar6 != 0) {
            uVar13 = uVar13 * 2;
            if (uVar13 == 0x8000) {
              pjVar5 = cinfo->err;
              pjVar5->msg_code = 0x7e;
              (*pjVar5->emit_message)((j_common_ptr)cinfo,-1);
              pjVar3[1].insufficient_data = -1;
              return 1;
            }
            p_Var10 = p_Var10 + 1;
            iVar6 = arith_decode(cinfo,(uchar *)p_Var10);
          }
        }
        iVar6 = 0;
        if ((int)((ulong)(1L << (cinfo->arith_dc_L[iVar2] & 0x3f)) >> 1) <= (int)uVar13) {
          if ((int)((ulong)(1L << (cinfo->arith_dc_U[iVar2] & 0x3f)) >> 1) < (int)uVar13) {
            iVar6 = uVar7 * 4 + 0xc;
          }
          else {
            iVar6 = uVar7 * 4 + 4;
          }
        }
        *(int *)((long)&pjVar3[2].decode_mcu + lVar12 * 4 + 4) = iVar6;
        uVar11 = uVar13;
        if (1 < uVar13) {
          do {
            uVar13 = (int)uVar13 >> 1;
            uVar8 = arith_decode(cinfo,(uchar *)(p_Var10 + 0xe));
            if (uVar8 != 0) {
              uVar8 = uVar13;
            }
            uVar11 = uVar11 | uVar8;
          } while (1 < uVar13);
        }
        uVar13 = ~uVar11;
        if (uVar7 == 0) {
          uVar13 = uVar11 + 1;
        }
        *(uint *)(&pjVar3[1].field_0x14 + lVar12 * 4) =
             uVar13 + *(int *)(&pjVar3[1].field_0x14 + lVar12 * 4) & 0xffff;
      }
      (*paJVar4)[0] =
           (short)*(undefined4 *)(&pjVar3[1].field_0x14 + lVar12 * 4) << ((byte)cinfo->Al & 0x3f);
      lVar9 = lVar9 + 1;
    } while (lVar9 < cinfo->blocks_in_MCU);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_first(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  int Al = cinfo->Al;
  register int s, r;
  int blkn, ci;
  JBLOCKROW block;
  BITREAD_STATE_VARS;
  savable_state state;
  d_derived_tbl *tbl;
  jpeg_component_info *compptr;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (!process_restart(cinfo))
        return FALSE;
  }

  /* If we've run out of data, just leave the MCU set to zeroes.
   * This way, we return uniform gray for the remainder of the segment.
   */
  if (!entropy->pub.insufficient_data) {

    /* Load up working state */
    BITREAD_LOAD_STATE(cinfo, entropy->bitstate);
    state = entropy->saved;

    /* Outer loop handles each block in the MCU */

    for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
      block = MCU_data[blkn];
      ci = cinfo->MCU_membership[blkn];
      compptr = cinfo->cur_comp_info[ci];
      tbl = entropy->derived_tbls[compptr->dc_tbl_no];

      /* Decode a single block's worth of coefficients */

      /* Section F.2.2.1: decode the DC coefficient difference */
      HUFF_DECODE(s, br_state, tbl, return FALSE, label1);
      if (s) {
        CHECK_BIT_BUFFER(br_state, s, return FALSE);
        r = GET_BITS(s);
        s = HUFF_EXTEND(r, s);
      }

      /* Convert DC difference to actual value, update last_dc_val */
      if ((state.last_dc_val[ci] >= 0 &&
           s > INT_MAX - state.last_dc_val[ci]) ||
          (state.last_dc_val[ci] < 0 && s < INT_MIN - state.last_dc_val[ci]))
        ERREXIT(cinfo, JERR_BAD_DCT_COEF);
      s += state.last_dc_val[ci];
      state.last_dc_val[ci] = s;
      /* Scale and output the coefficient (assumes jpeg_natural_order[0]=0) */
      (*block)[0] = (JCOEF)LEFT_SHIFT(s, Al);
    }

    /* Completed MCU, so update state */
    BITREAD_SAVE_STATE(cinfo, entropy->bitstate);
    entropy->saved = state;
  }

  /* Account for restart interval (no-op if not using restarts) */
  if (cinfo->restart_interval)
    entropy->restarts_to_go--;

  return TRUE;
}